

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                    (uint8_t *buffer,uint64_t *value)

{
  byte bVar1;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  size_t offset;
  size_t i;
  uint64_t result;
  LogMessageFatal local_40 [19];
  Voidify local_2d;
  int local_2c;
  unsigned_long local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  uint64_t *value_local;
  uint8_t *buffer_local;
  
  absl_log_internal_check_op_result = (string *)value;
  value_local = (uint64_t *)buffer;
  local_28 = absl::lts_20240722::log_internal::GetReferenceableValue(10);
  local_2c = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GTImpl<unsigned_long,int>
                       (&local_28,&local_2c,"N > 0");
  if (local_20 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x198,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_2d,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  i = (ulong)*(byte *)((long)value_local + 9) << 0x3f;
  bVar1 = 0;
  for (offset = 0; offset < 9; offset = offset + 1) {
    i = ((long)(int)(*(byte *)((long)value_local + offset) - 0x80) << (bVar1 & 0x3f)) + i;
    bVar1 = bVar1 + 7;
  }
  *(size_t *)absl_log_internal_check_op_result = i;
  return (uint8_t *)((long)value_local + 10);
}

Assistant:

const uint8_t* DecodeVarint64KnownSize(const uint8_t* buffer, uint64_t* value) {
  ABSL_DCHECK_GT(N, 0);
  uint64_t result = static_cast<uint64_t>(buffer[N - 1]) << (7 * (N - 1));
  for (size_t i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64_t>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}